

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O0

void __thiscall
InstantiateConcreteMustFail_Test6_Test::InstantiateConcreteMustFail_Test6_Test
          (InstantiateConcreteMustFail_Test6_Test *this)

{
  InstantiateConcreteMustFail_Test6_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__InstantiateConcreteMustFail_Test6_Test_0023e850;
  return;
}

Assistant:

TEST(InstantiateConcreteMustFail, Test6){
    Infector::Container ioc;

    ioc.bindAs<ComfortableBed,  IBed>();

    ioc.wire<ComfortableBed>();

    auto bed = ioc.build<IBed>();
    bool testPass = false;
    try{
        ioc.build<ComfortableBed>();
    }
    catch(std::exception &ex){
        std::cout<<"ex 1"<<std::endl;
        std::cout<<ex.what()<<std::endl;
        testPass=true;
    }

    EXPECT_TRUE(testPass);
}